

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

void __thiscall
helics::udp::UdpServer::UdpServer
          (UdpServer *this,io_context *io_context,string_view interface,uint16_t portNum)

{
  socklen_t in_ECX;
  int __oflag;
  sockaddr *__addr;
  long in_RDI;
  allocator<char> *__a;
  string *in_stack_ffffffffffffff28;
  function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_54 [2];
  
  CLI::std::enable_shared_from_this<helics::udp::UdpServer>::enable_shared_from_this
            ((enable_shared_from_this<helics::udp::UdpServer> *)0x20b765);
  __a = (allocator<char> *)(in_RDI + 0x10);
  ::asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
  basic_datagram_socket<asio::io_context>
            ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
             in_stack_ffffffffffffff30,(io_context *)in_stack_ffffffffffffff28,0);
  ::asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
            ((basic_endpoint<asio::ip::udp> *)0x20b792);
  memset((void *)(in_RDI + 0x84),0,0x400);
  CLI::std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>::
  function(in_stack_ffffffffffffff30);
  local_54[0].field_2._12_4_ = ::asio::ip::udp::v4();
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            ((basic_socket<asio::ip::udp,_asio::any_io_executor> *)(in_RDI + 0x10),
             local_54[0].field_2._M_local_buf + 0xc,__oflag);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
  ::asio::ip::address::from_string(in_stack_ffffffffffffff28);
  this_00 = local_54;
  ::asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
            ((basic_endpoint<asio::ip::udp> *)this_00,(address *)in_stack_ffffffffffffff28,0);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            ((basic_socket<asio::ip::udp,_asio::any_io_executor> *)(in_RDI + 0x10),(int)this_00,
             __addr,in_ECX);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  return;
}

Assistant:

UdpServer(asio::io_context& io_context, std::string_view interface, std::uint16_t portNum):
            mSocket(io_context)
        {
            mSocket.open(asio::ip::udp::v4());
            mSocket.bind(
                asio::ip::udp::endpoint(asio::ip::address::from_string(std::string(interface)),
                                        portNum));
        }